

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_rowcol_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  long lVar1;
  int *piVar2;
  parasail_result_t *ppVar3;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  int *ptr_09;
  int *ptr_10;
  int *ptr_11;
  int *ptr_12;
  int *ptr_13;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  undefined4 uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined4 uVar15;
  int a;
  ulong uVar16;
  size_t size;
  size_t size_00;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_stats_rowcol_scan_cold_8();
  }
  else if (s2Len < 1) {
    parasail_nw_stats_rowcol_scan_cold_7();
  }
  else if (open < 0) {
    parasail_nw_stats_rowcol_scan_cold_6();
  }
  else if (gap < 0) {
    parasail_nw_stats_rowcol_scan_cold_5();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_stats_rowcol_scan_cold_4();
  }
  else {
    uVar16 = (ulong)(uint)_s1Len;
    if (matrix->type == 1) {
      if (_s1 == (char *)0x0) {
        parasail_nw_stats_rowcol_scan_cold_3();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      if (_s1 == (char *)0x0) {
        parasail_nw_stats_rowcol_scan_cold_2();
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        parasail_nw_stats_rowcol_scan_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    if (matrix->type != 0) {
      uVar16 = (ulong)(uint)matrix->length;
    }
    a = (int)uVar16;
    ppVar3 = parasail_result_new_rowcol3(a,s2Len);
    if (ppVar3 != (parasail_result_t *)0x0) {
      ppVar3->flag = ppVar3->flag | 0x1450201;
      size_00 = (size_t)a;
      ptr = parasail_memalign_int(0x10,size_00);
      ptr_00 = parasail_memalign_int(0x10,(ulong)(uint)s2Len);
      size = (size_t)(a + 1);
      ptr_01 = parasail_memalign_int(0x10,size);
      ptr_02 = parasail_memalign_int(0x10,size);
      ptr_03 = parasail_memalign_int(0x10,size);
      ptr_04 = parasail_memalign_int(0x10,size);
      ptr_05 = parasail_memalign_int(0x10,size_00);
      ptr_06 = parasail_memalign_int(0x10,size_00);
      ptr_07 = parasail_memalign_int(0x10,size_00);
      ptr_08 = parasail_memalign_int(0x10,size_00);
      ptr_09 = parasail_memalign_int(0x10,size);
      ptr_10 = parasail_memalign_int(0x10,size);
      ptr_11 = parasail_memalign_int(0x10,size);
      ptr_12 = parasail_memalign_int(0x10,size);
      ptr_13 = parasail_memalign_int(0x10,size_00);
      if (ptr == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_00 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_01 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_02 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_03 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_04 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_05 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_06 != (int *)0x0) {
        if (ptr_07 == (int *)0x0) {
          return (parasail_result_t *)0x0;
        }
        if (ptr_08 == (int *)0x0) {
          return (parasail_result_t *)0x0;
        }
        if (ptr_09 == (int *)0x0) {
          return (parasail_result_t *)0x0;
        }
        if (ptr_10 != (int *)0x0) {
          if (ptr_11 == (int *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (ptr_12 != (int *)0x0) {
            if (ptr_13 != (int *)0x0) {
              if (0 < a) {
                piVar2 = matrix->mapper;
                uVar8 = 0;
                do {
                  ptr[uVar8] = piVar2[(byte)_s1[uVar8]];
                  uVar8 = uVar8 + 1;
                } while (uVar16 != uVar8);
              }
              piVar2 = matrix->mapper;
              uVar8 = 1;
              if (1 < s2Len) {
                uVar8 = (ulong)(uint)s2Len;
              }
              uVar11 = 0;
              do {
                ptr_00[uVar11] = piVar2[(byte)_s2[uVar11]];
                uVar11 = uVar11 + 1;
              } while (uVar8 != uVar11);
              *ptr_01 = 0;
              *ptr_02 = 0;
              *ptr_03 = 0;
              *ptr_04 = 0;
              *ptr_09 = 0;
              if (0 < a) {
                iVar6 = -open;
                uVar8 = 0;
                do {
                  ptr_01[uVar8 + 1] = iVar6;
                  ptr_02[uVar8 + 1] = 0;
                  ptr_03[uVar8 + 1] = 0;
                  ptr_04[uVar8 + 1] = 0;
                  uVar8 = uVar8 + 1;
                  iVar6 = iVar6 - gap;
                } while (uVar16 != uVar8);
              }
              if (0 < a) {
                uVar8 = 0;
                do {
                  ptr_05[uVar8] = -0x40000000;
                  ptr_06[uVar8] = 0;
                  ptr_07[uVar8] = 0;
                  ptr_08[uVar8] = 0;
                  uVar8 = uVar8 + 1;
                } while (uVar16 != uVar8);
              }
              iVar6 = a + -1;
              uVar8 = 1;
              if (1 < s2Len) {
                uVar8 = (ulong)(uint)s2Len;
              }
              lVar1 = uVar16 * 4;
              uVar11 = 0;
              do {
                if (0 < a) {
                  lVar5 = 0;
                  do {
                    iVar4 = *(int *)((long)ptr_01 + lVar5 + 4) - open;
                    iVar7 = *(int *)((long)ptr_05 + lVar5) - gap;
                    if (iVar7 < iVar4) {
                      *(int *)((long)ptr_05 + lVar5) = iVar4;
                      *(undefined4 *)((long)ptr_06 + lVar5) =
                           *(undefined4 *)((long)ptr_02 + lVar5 + 4);
                      *(undefined4 *)((long)ptr_07 + lVar5) =
                           *(undefined4 *)((long)ptr_03 + lVar5 + 4);
                      *(undefined4 *)((long)ptr_08 + lVar5) =
                           *(undefined4 *)((long)ptr_04 + lVar5 + 4);
                    }
                    else {
                      *(int *)((long)ptr_05 + lVar5) = iVar7;
                    }
                    *(int *)((long)ptr_08 + lVar5) = *(int *)((long)ptr_08 + lVar5) + 1;
                    lVar5 = lVar5 + 4;
                  } while (lVar1 - lVar5 != 0);
                }
                iVar4 = -((int)uVar11 * gap + open);
                *ptr_09 = iVar4;
                if (0 < a) {
                  piVar2 = matrix->matrix;
                  uVar9 = 0;
                  do {
                    if (matrix->type == 0) {
                      iVar7 = ptr[uVar9] * matrix->size;
                    }
                    else {
                      iVar7 = matrix->size * (int)uVar9;
                    }
                    iVar7 = piVar2[(long)iVar7 + (long)ptr_00[uVar11]];
                    iVar12 = ptr_01[uVar9] + iVar7;
                    ptr_13[uVar9] = (uint)(iVar12 < ptr_05[uVar9]);
                    if (iVar12 < ptr_05[uVar9]) {
                      ptr_09[uVar9 + 1] = ptr_05[uVar9];
                      ptr_10[uVar9 + 1] = ptr_06[uVar9];
                      ptr_11[uVar9 + 1] = ptr_07[uVar9];
                      iVar7 = ptr_08[uVar9];
                    }
                    else {
                      ptr_09[uVar9 + 1] = iVar12;
                      ptr_10[uVar9 + 1] = (uint)(ptr[uVar9] == ptr_00[uVar11]) + ptr_02[uVar9];
                      ptr_11[uVar9 + 1] = (uint)(0 < iVar7) + ptr_03[uVar9];
                      iVar7 = ptr_04[uVar9] + 1;
                    }
                    ptr_12[uVar9 + 1] = iVar7;
                    uVar9 = uVar9 + 1;
                  } while (uVar16 != uVar9);
                }
                if (0 < a) {
                  iVar12 = -0x40000000;
                  lVar5 = 0;
                  iVar7 = 0;
                  uVar10 = 0;
                  uVar15 = 0;
                  do {
                    iVar13 = iVar12 - gap;
                    iVar12 = *(int *)((long)ptr_09 + lVar5);
                    if (*(int *)((long)ptr_09 + lVar5) <= iVar13) {
                      iVar12 = iVar13;
                    }
                    if (iVar13 < *(int *)((long)ptr_01 + lVar5)) {
                      uVar15 = *(undefined4 *)((long)ptr_02 + lVar5);
                      uVar10 = *(undefined4 *)((long)ptr_03 + lVar5);
                      iVar7 = *(int *)((long)ptr_04 + lVar5);
                    }
                    iVar14 = iVar12 - open;
                    iVar7 = iVar7 + 1;
                    iVar13 = *(int *)((long)ptr_09 + lVar5 + 4);
                    if (iVar14 < iVar13) {
                      *(int *)((long)ptr_01 + lVar5 + 4) = iVar13;
                      *(undefined4 *)((long)ptr_02 + lVar5 + 4) =
                           *(undefined4 *)((long)ptr_10 + lVar5 + 4);
                      *(undefined4 *)((long)ptr_03 + lVar5 + 4) =
                           *(undefined4 *)((long)ptr_11 + lVar5 + 4);
                      iVar13 = *(int *)((long)ptr_12 + lVar5 + 4);
                    }
                    else {
                      *(int *)((long)ptr_01 + lVar5 + 4) = iVar14;
                      iVar13 = iVar7;
                      if (*(int *)((long)ptr_09 + lVar5 + 4) == iVar14) {
                        if (*(int *)((long)ptr_13 + lVar5) == 0) {
                          *(undefined4 *)((long)ptr_02 + lVar5 + 4) =
                               *(undefined4 *)((long)ptr_10 + lVar5 + 4);
                          *(undefined4 *)((long)ptr_03 + lVar5 + 4) =
                               *(undefined4 *)((long)ptr_11 + lVar5 + 4);
                          iVar13 = *(int *)((long)ptr_12 + lVar5 + 4);
                        }
                        else {
                          *(undefined4 *)((long)ptr_02 + lVar5 + 4) = uVar15;
                          *(undefined4 *)((long)ptr_03 + lVar5 + 4) = uVar10;
                        }
                      }
                      else {
                        *(undefined4 *)((long)ptr_02 + lVar5 + 4) = uVar15;
                        *(undefined4 *)((long)ptr_03 + lVar5 + 4) = uVar10;
                      }
                    }
                    *(int *)((long)ptr_04 + lVar5 + 4) = iVar13;
                    lVar5 = lVar5 + 4;
                  } while (lVar1 - lVar5 != 0);
                }
                *ptr_01 = iVar4;
                if (uVar11 == s2Len - 1U && 0 < a) {
                  lVar5 = 0;
                  do {
                    *(undefined4 *)
                     (*(long *)((long)((ppVar3->field_4).trace)->trace_del_table + 0x20) + lVar5) =
                         *(undefined4 *)((long)ptr_01 + lVar5 + 4);
                    *(undefined4 *)
                     (*(long *)((long)((ppVar3->field_4).trace)->trace_del_table + 0x28) + lVar5) =
                         *(undefined4 *)((long)ptr_02 + lVar5 + 4);
                    *(undefined4 *)
                     (*(long *)((long)((ppVar3->field_4).trace)->trace_del_table + 0x30) + lVar5) =
                         *(undefined4 *)((long)ptr_03 + lVar5 + 4);
                    *(undefined4 *)
                     (*(long *)((long)((ppVar3->field_4).trace)->trace_del_table + 0x38) + lVar5) =
                         *(undefined4 *)((long)ptr_04 + lVar5 + 4);
                    lVar5 = lVar5 + 4;
                  } while (lVar1 - lVar5 != 0);
                }
                *(int *)(*((ppVar3->field_4).trace)->trace_del_table + uVar11 * 4) =
                     ptr_01[(long)iVar6 + 1];
                *(int *)(*(long *)((long)((ppVar3->field_4).trace)->trace_del_table + 8) +
                        uVar11 * 4) = ptr_02[(long)iVar6 + 1];
                *(int *)(*(long *)((long)((ppVar3->field_4).trace)->trace_del_table + 0x10) +
                        uVar11 * 4) = ptr_03[(long)iVar6 + 1];
                *(int *)(*(long *)((long)((ppVar3->field_4).trace)->trace_del_table + 0x18) +
                        uVar11 * 4) = ptr_04[(long)iVar6 + 1];
                uVar11 = uVar11 + 1;
              } while (uVar11 != uVar8);
              ppVar3->score = ptr_01[size_00];
              ppVar3->end_query = iVar6;
              ppVar3->end_ref = s2Len - 1U;
              ((ppVar3->field_4).stats)->matches = ptr_02[size_00];
              ((ppVar3->field_4).stats)->similar = ptr_03[size_00];
              ((ppVar3->field_4).stats)->length = ptr_04[size_00];
              parasail_free(ptr_13);
              parasail_free(ptr_12);
              parasail_free(ptr_11);
              parasail_free(ptr_10);
              parasail_free(ptr_09);
              parasail_free(ptr_08);
              parasail_free(ptr_07);
              parasail_free(ptr_06);
              parasail_free(ptr_05);
              parasail_free(ptr_04);
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar3;
            }
            return (parasail_result_t *)0x0;
          }
          return (parasail_result_t *)0x0;
        }
        return (parasail_result_t *)0x0;
      }
      return (parasail_result_t *)0x0;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H = NULL;
    int * restrict HMB = NULL;
    int * restrict HM = NULL;
    int * restrict HSB = NULL;
    int * restrict HS = NULL;
    int * restrict HLB = NULL;
    int * restrict HL = NULL;
    int * restrict E = NULL;
    int * restrict EM = NULL;
    int * restrict ES = NULL;
    int * restrict EL = NULL;
    int * restrict HtB = NULL;
    int * restrict Ht = NULL;
    int * restrict HtMB = NULL;
    int * restrict HtM = NULL;
    int * restrict HtSB = NULL;
    int * restrict HtS = NULL;
    int * restrict HtLB = NULL;
    int * restrict HtL = NULL;
    int * restrict Ex = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    HMB = parasail_memalign_int(16, s1Len+1);
    HM  = HMB+1;
    HSB = parasail_memalign_int(16, s1Len+1);
    HS  = HSB+1;
    HLB = parasail_memalign_int(16, s1Len+1);
    HL  = HLB+1;
    E  = parasail_memalign_int(16, s1Len);
    EM = parasail_memalign_int(16, s1Len);
    ES = parasail_memalign_int(16, s1Len);
    EL = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;
    HtMB= parasail_memalign_int(16, s1Len+1);
    HtM = HtMB+1;
    HtSB= parasail_memalign_int(16, s1Len+1);
    HtS = HtSB+1;
    HtLB= parasail_memalign_int(16, s1Len+1);
    HtL = HtLB+1;
    Ex = parasail_memalign_int(16, s1Len);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!HMB) return NULL;
    if (!HSB) return NULL;
    if (!HLB) return NULL;
    if (!E) return NULL;
    if (!EM) return NULL;
    if (!ES) return NULL;
    if (!EL) return NULL;
    if (!HtB) return NULL;
    if (!HtMB) return NULL;
    if (!HtSB) return NULL;
    if (!HtLB) return NULL;
    if (!Ex) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H,HM,HS,HL */
    H[-1] = 0;
    HM[-1] = 0;
    HS[-1] = 0;
    HL[-1] = 0;
    Ht[-1] = 0;
    for (i=0; i<s1Len; ++i) {
        H[i] = -open - i*gap;
        HM[i] = 0;
        HS[i] = 0;
        HL[i] = 0;
    }

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
        EM[i] = 0;
        ES[i] = 0;
        EL[i] = 0;
    }

    /* iterate over database */
    for (j=0; j<s2Len; ++j) {
        int Ft = NEG_INF_32;
        int FtM = 0;
        int FtS = 0;
        int FtL = 0;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            int E_opn = H[i]-open;
            int E_ext = E[i]-gap;
            if (E_opn > E_ext) {
                E[i] = E_opn;
                EM[i] = HM[i];
                ES[i] = HS[i];
                EL[i] = HL[i];
            }
            else {
                E[i] = E_ext;
            }
            EL[i] += 1;
        }
        /* calculate Ht */
        Ht[-1] = -open -j*gap;
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            int H_dag = H[i-1]+matval;
            Ex[i] = (E[i] > H_dag);
            if (H_dag >= E[i]) {
                Ht[i] = H_dag;
                HtM[i] = HM[i-1] + (s1[i]==s2[j]);
                HtS[i] = HS[i-1] + (matval > 0);
                HtL[i] = HL[i-1] + 1;
            }
            else {
                Ht[i] = E[i];
                HtM[i] = EM[i];
                HtS[i] = ES[i];
                HtL[i] = EL[i];
            }
        }
        /* calculate H,HM,HS,HL */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            if (H[i-1] > Ft_ext) {
                FtM = HM[i-1];
                FtS = HS[i-1];
                FtL = HL[i-1] + 1;
            }
            else {
                FtL = FtL + 1;
            }
            if (Ht[i] > Ft_opn) {
                H[i] = Ht[i];
                HM[i] = HtM[i];
                HS[i] = HtS[i];
                HL[i] = HtL[i];
            }
            else {
                H[i] = Ft_opn;
                if (Ht[i] == Ft_opn) {
                    if (Ex[i]) {
                        /* we favor F/up/del when F and E scores tie */
                        HM[i] = FtM;
                        HS[i] = FtS;
                        HL[i] = FtL;
                    }
                    else {
                        HM[i] = HtM[i];
                        HS[i] = HtS[i];
                        HL[i] = HtL[i];
                    }
                }
                else {
                    HM[i] = FtM;
                    HS[i] = FtS;
                    HL[i] = FtL;
                }
            }
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*i*s2Len + j] = H[i];
            result->stats->tables->matches_table[1LL*i*s2Len + j] = HM[i];
            result->stats->tables->similar_table[1LL*i*s2Len + j] = HS[i];
            result->stats->tables->length_table[1LL*i*s2Len + j] = HL[i];
#endif
        }
        H[-1] = -open - j*gap;
#ifdef PARASAIL_ROWCOL
        if (j == s2Len-1) {
            for (i=0; i<s1Len; ++i) {
                result->stats->rowcols->score_col[i] = H[i];
                result->stats->rowcols->matches_col[i] = HM[i];
                result->stats->rowcols->similar_col[i] = HS[i];
                result->stats->rowcols->length_col[i] = HL[i];
            }
        }
        result->stats->rowcols->score_row[j] = H[s1Len-1];
        result->stats->rowcols->matches_row[j] = HM[s1Len-1];
        result->stats->rowcols->similar_row[j] = HS[s1Len-1];
        result->stats->rowcols->length_row[j] = HL[s1Len-1];
#endif
    }

    result->score = H[s1Len-1];
    result->end_query = s1Len-1;
    result->end_ref = s2Len-1;
    result->stats->matches = HM[s1Len-1];
    result->stats->similar = HS[s1Len-1];
    result->stats->length = HL[s1Len-1];

    parasail_free(Ex);
    parasail_free(HtLB);
    parasail_free(HtSB);
    parasail_free(HtMB);
    parasail_free(HtB);
    parasail_free(EL);
    parasail_free(ES);
    parasail_free(EM);
    parasail_free(E);
    parasail_free(HLB);
    parasail_free(HSB);
    parasail_free(HMB);
    parasail_free(HB);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}